

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

void sort_5_3::test(void)

{
  long lVar1;
  int extraout_EDX;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined *puVar5;
  string *this;
  int iVar6;
  allocator aStack_51;
  string sStack_50;
  string sStack_30;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x103132;
  ps_int((int *)&DAT_00104160,10);
  puVar5 = &DAT_00104160;
  uVar4 = 0;
  pcStack_10 = test_5_3_1::del_hash;
  merge_sort_4((int *)&DAT_00104160,0,9);
  pcStack_10 = (code *)&DAT_00104160;
  iVar3 = (int)uVar4;
  iVar2 = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) % 7);
  if (*(int *)(puVar5 + (long)iVar2 * 4) == iVar3) {
    std::__cxx11::string::string((string *)&sStack_30,anon_var_dwarf_21f9,&aStack_51);
    errCode(&sStack_30,1);
    this = &sStack_30;
LAB_001031d5:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    iVar6 = 1;
    do {
      if (extraout_EDX <= iVar6) {
        std::__cxx11::string::string((string *)&sStack_50,anon_var_dwarf_21ee,&aStack_51);
        errCode(&sStack_50,0);
        this = &sStack_50;
        goto LAB_001031d5;
      }
      lVar1 = (long)((iVar2 + iVar6) % 7);
      iVar6 = iVar6 + 1;
    } while (*(int *)(puVar5 + lVar1 * 4) != iVar3);
    *(undefined4 *)(puVar5 + lVar1 * 4) = 0xffffffff;
  }
  return;
}

Assistant:

void test() {
        int a1[] = {12, 4, 67, 5, 88, 15, 34, 26, 33, 19};
        ps_int(a1, 10);
//        select_sort_1(a1, 10);
//        bubble_sort_1(a1, 10);
//        insert_sort_1(a1, 10);
//        insert_sort_b_1(a1, 10);
//        shell_sort_1(a1, 10);
//        quick_sort_2(a1, 0, 9);
//        heap_sort_4(a1, 10);
        merge_sort_4(a1, 0, 9);
        ps_int(a1, 10);
    }